

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_gp.cpp
# Opt level: O0

void __thiscall tlm::tlm_generic_payload::tlm_generic_payload(tlm_generic_payload *this)

{
  undefined8 *in_RDI;
  size_type in_stack_00000018;
  tlm_array<tlm::tlm_extension_base_*> *in_stack_00000020;
  
  *in_RDI = &PTR__tlm_generic_payload_00366ef0;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 2;
  in_RDI[3] = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined1 *)(in_RDI + 5) = 0;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  max_num_extensions();
  tlm_array<tlm::tlm_extension_base_*>::tlm_array(in_stack_00000020,in_stack_00000018);
  in_RDI[0xf] = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

tlm_generic_payload::tlm_generic_payload()
  : m_address(0)
  , m_command(TLM_IGNORE_COMMAND)
  , m_data(0)
  , m_length(0)
  , m_response_status(TLM_INCOMPLETE_RESPONSE)
  , m_dmi(false)
  , m_byte_enable(0)
  , m_byte_enable_length(0)
  , m_streaming_width(0)
  , m_gp_option(TLM_MIN_PAYLOAD)
  , m_extensions(max_num_extensions())
  , m_mm(0)
  , m_ref_count(0)
{}